

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,-1,0,3,-1>,0,Eigen::Stride<0,0>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,_3,__1,_0,_3,__1>,_0,_Eigen::Stride<0,_0>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_01;
  bool bVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_01;
  difference_type dVar2;
  scalar_type *psVar3;
  node_type *pnVar4;
  undefined4 uVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDX;
  undefined4 in_ESI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_R8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> unaff_retaddr;
  size_type *in_stack_00000010;
  scalar_type *in_stack_00000018;
  box_type right;
  scalar_type split_val;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  node_type *node;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff08;
  undefined1 *i;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,_3,__1,_0,_3,__1>,_0,_Eigen::Stride<0,_0>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
  *in_stack_ffffffffffffff10;
  box<float,_3UL> *this_00;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  scalar_type sVar6;
  undefined4 in_stack_ffffffffffffff24;
  box_base<pico_tree::internal::box<float,_3UL>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined1 local_74 [36];
  int *local_50;
  int *local_48;
  value_type *pvVar7;
  index_type depth_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  end_01._M_current =
       (int *)chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>::
              allocate((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_256UL>
                        *)in_stack_ffffffffffffff10);
  begin_00._M_current._4_4_ = in_stack_ffffffffffffff24;
  begin_00._M_current._0_4_ = in_stack_ffffffffffffff20;
  end_00._M_current._4_4_ = in_stack_ffffffffffffff1c;
  end_00._M_current._0_4_ = in_stack_ffffffffffffff18;
  bVar1 = is_leaf<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_ffffffffffffff10,
                     (index_type)((ulong)in_stack_ffffffffffffff08 >> 0x20),begin_00,end_00);
  if (bVar1) {
    pvVar7 = (value_type *)end_01._M_current;
    local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
    dVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff10,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff08);
    uVar5 = (undefined4)dVar2;
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff08);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff10,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff08);
    kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>::set_leaf<int>
              ((kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
    begin_01._M_current._4_4_ = uVar5;
    begin_01._M_current._0_4_ = in_stack_ffffffffffffff30;
    compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,_3,__1,_0,_3,__1>,_0,_Eigen::Stride<0,_0>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
                *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),begin_01,end_01,
               (box_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(local_74 + 0xc)
              );
    i = local_74 + 4;
    this_00 = (box<float,_3UL> *)local_74;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,3,-1,0,3,-1>,0,Eigen::Stride<0,0>>>>
    ::operator()((splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,_3,__1,_0,_3,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)in_RCX._M_current,(value_type)((ulong)in_RDI._M_current >> 0x20),unaff_retaddr,
                 in_RDX,(box_type *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_R8,
                 in_stack_00000010,in_stack_00000018);
    depth_00 = (index_type)((ulong)in_R8 >> 0x20);
    sVar6 = (scalar_type)local_74._0_4_;
    psVar3 = box<float,_3UL>::max(this_00,(size_type)i);
    *psVar3 = sVar6;
    psVar3 = box<float,_3UL>::min(this_00,(size_type)i);
    *psVar3 = (scalar_type)local_74._0_4_;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,_3,__1,_0,_3,__1>,_0,_Eigen::Stride<0,_0>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,in_RDI,
                        (box_type *)end_01._M_current);
    (((value_type *)end_01._M_current)->
    super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).left = pnVar4
    ;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<Eigen::Map<Eigen::Matrix<float,_3,__1,_0,_3,__1>,_0,_Eigen::Stride<0,_0>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_float>,_3UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,in_RDI,
                        (box_type *)end_01._M_current);
    (((value_type *)end_01._M_current)->
    super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>).right =
         pnVar4;
    kd_tree_node_euclidean<int,float>::set_branch<pico_tree::internal::box<float,3ul>>
              ((kd_tree_node_euclidean<int,_float> *)CONCAT44(local_74._0_4_,sVar6),
               (box<float,_3UL> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               this_00,(size_t)i);
    box_base<pico_tree::internal::box<float,3ul>>::fit<pico_tree::internal::box<float,3ul>>
              ((box_base<pico_tree::internal::box<float,_3UL>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    pvVar7 = (value_type *)end_01._M_current;
  }
  return pvVar7;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }